

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::generateDummyCompressedData
               (CompressedTexture *dst,CompressedTexFormat *format)

{
  bool bVar1;
  deUint8 dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int blockSize;
  void *pvVar7;
  int local_70;
  undefined1 local_6c [4];
  int ndx_1;
  Random rnd;
  int ndx;
  deUint8 block [16];
  int BLOCK_SIZE;
  int dataSize;
  int numTotalBlocks;
  IVec3 numBlocks;
  IVec3 blockPixelSize;
  int blockByteSize;
  CompressedTexFormat *format_local;
  CompressedTexture *dst_local;
  
  iVar3 = tcu::getBlockSize(*format);
  tcu::getBlockPixelSize((tcu *)(numBlocks.m_data + 1),*format);
  iVar4 = tcu::CompressedTexture::getWidth(dst);
  iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(numBlocks.m_data + 1));
  iVar4 = getDimensionNumBlocks(iVar4,iVar5);
  iVar5 = tcu::CompressedTexture::getHeight(dst);
  iVar6 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(numBlocks.m_data + 1));
  iVar5 = getDimensionNumBlocks(iVar5,iVar6);
  iVar6 = tcu::CompressedTexture::getDepth(dst);
  blockSize = tcu::Vector<int,_3>::z((Vector<int,_3> *)(numBlocks.m_data + 1));
  iVar6 = getDimensionNumBlocks(iVar6,blockSize);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&dataSize,iVar4,iVar5,iVar6);
  iVar4 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&dataSize);
  iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&dataSize);
  iVar6 = tcu::Vector<int,_3>::z((Vector<int,_3> *)&dataSize);
  iVar6 = iVar4 * iVar5 * iVar6;
  bVar1 = tcu::isAstcFormat(*format);
  if (bVar1) {
    stack0xffffffffffffffa8 = 0xfffffffffffffdfc;
    for (rnd.m_rnd.z = 0; (int)rnd.m_rnd.z < iVar6; rnd.m_rnd.z = rnd.m_rnd.z + 1) {
      pvVar7 = tcu::CompressedTexture::getData(dst);
      ::deMemcpy((void *)((long)pvVar7 + (long)(int)(rnd.m_rnd.z << 4)),&rnd.m_rnd.w,0x10);
    }
  }
  else {
    de::Random::Random((Random *)local_6c,0xabc);
    for (local_70 = 0; local_70 < iVar6 * iVar3; local_70 = local_70 + 1) {
      dVar2 = de::Random::getUint8((Random *)local_6c);
      pvVar7 = tcu::CompressedTexture::getData(dst);
      *(deUint8 *)((long)pvVar7 + (long)local_70) = dVar2;
    }
    de::Random::~Random((Random *)local_6c);
  }
  return;
}

Assistant:

void generateDummyCompressedData (tcu::CompressedTexture& dst, const tcu::CompressedTexFormat& format)
{
	const int			blockByteSize	= tcu::getBlockSize(format);
	const tcu::IVec3	blockPixelSize	= tcu::getBlockPixelSize(format);
	const tcu::IVec3	numBlocks		(getDimensionNumBlocks(dst.getWidth(),    blockPixelSize.x()),
										 getDimensionNumBlocks(dst.getHeight(),   blockPixelSize.y()),
										 getDimensionNumBlocks(dst.getDepth(),    blockPixelSize.z()));
	const int			numTotalBlocks	= numBlocks.x() * numBlocks.y() * numBlocks.z();
	const int			dataSize		= numTotalBlocks * blockByteSize;

	DE_ASSERT(dst.getDataSize() == dataSize);

	if (tcu::isAstcFormat(format))
	{
		// generate data that is valid in LDR mode
		const int		BLOCK_SIZE			= 16;
		const deUint8	block[BLOCK_SIZE]	= { 252, 253, 255, 255, 255, 255, 255, 255, 223, 251, 28, 206, 54, 251, 160, 174 };

		DE_ASSERT(blockByteSize == BLOCK_SIZE);
		for (int ndx = 0; ndx < numTotalBlocks; ++ndx)
			deMemcpy((deUint8*)dst.getData() + ndx * BLOCK_SIZE, block, BLOCK_SIZE);
	}
	else
	{
		// any data is ok
		de::Random rnd(0xabc);

		for (int ndx = 0; ndx < dataSize; ++ndx)
			((deUint8*)dst.getData())[ndx] = rnd.getUint8();
	}
}